

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance.cpp
# Opt level: O1

void __thiscall embree::Instance::~Instance(Instance *this)

{
  Device *pDVar1;
  long *plVar2;
  
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Instance_02203168;
  pDVar1 = (this->super_Geometry).device;
  (*(pDVar1->super_State).super_RefCount._vptr_RefCount[9])(pDVar1,this->local2world);
  pDVar1 = (this->super_Geometry).device;
  (*(pDVar1->super_State).super_RefCount._vptr_RefCount[4])
            (pDVar1,(ulong)(this->super_Geometry).numTimeSteps * -0x40,1);
  plVar2 = *(long **)&(this->super_Geometry).field_0x58;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x18))();
  }
  pDVar1 = (this->super_Geometry).device;
  (*(pDVar1->super_State).super_RefCount._vptr_RefCount[4])(pDVar1,0xffffffffffffff50,0);
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

Instance::~Instance()
  {
    device->free(local2world);
    device->memoryMonitor(-ssize_t(numTimeSteps*sizeof(AffineSpace3ff)), true);
    if (object) object->refDec();
    device->memoryMonitor(-sizeof(*this), false);
  }